

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O0

char * deqp::egl::Image::CreateImageGLES2::getStorageName(GLenum storage)

{
  char *pcStack_10;
  GLenum storage_local;
  
  if (storage == 0x1903) {
    pcStack_10 = "red";
  }
  else if (storage == 0x1907) {
    pcStack_10 = "rgb";
  }
  else if (storage == 0x1908) {
    pcStack_10 = "rgba";
  }
  else if (storage == 0x1909) {
    pcStack_10 = "luminance";
  }
  else if (storage == 0x190a) {
    pcStack_10 = "luminance_alpha";
  }
  else if (storage == 0x8051) {
    pcStack_10 = "rgb8";
  }
  else if (storage == 0x8056) {
    pcStack_10 = "rgba4";
  }
  else if (storage == 0x8057) {
    pcStack_10 = "rgb5_a1";
  }
  else if (storage == 0x8058) {
    pcStack_10 = "rgba8";
  }
  else if (storage == 0x81a5) {
    pcStack_10 = "depth_component_16";
  }
  else if (storage == 0x8227) {
    pcStack_10 = "rg";
  }
  else if (storage == 0x8d48) {
    pcStack_10 = "stencil_index8";
  }
  else if (storage == 0x8d62) {
    pcStack_10 = "rgb565";
  }
  else {
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

static const char* getStorageName (GLenum storage)
	{
		switch (storage)
		{
			case GL_RED:				return "red";
			case GL_RG:					return "rg";
			case GL_LUMINANCE:			return "luminance";
			case GL_LUMINANCE_ALPHA:	return "luminance_alpha";
			case GL_RGB:				return "rgb";
			case GL_RGBA:				return "rgba";
			case GL_DEPTH_COMPONENT16:	return "depth_component_16";
			case GL_RGBA4:				return "rgba4";
			case GL_RGB5_A1:			return "rgb5_a1";
			case GL_RGB565:				return "rgb565";
			case GL_RGB8:				return "rgb8";
			case GL_RGBA8:				return "rgba8";
			case GL_STENCIL_INDEX8:		return "stencil_index8";
			default:
				DE_ASSERT(DE_FALSE);
				return "";
		}
	}